

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bind.cpp
# Opt level: O1

void __thiscall lambda_bind_mem_fn_Test::TestBody(lambda_bind_mem_fn_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_28.ptr_._0_4_ = 6;
  local_20.data_._0_4_ = 6;
  testing::internal::CmpHelperEQ<int,int>
            (local_18,"lmd::bind(&Thing::fn)(&thing, 1, 2, 3)","6",(int *)&local_28,(int *)&local_20
            );
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
      local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_28.ptr_._0_4_ = 6;
    local_20.data_._0_4_ = 6;
    testing::internal::CmpHelperEQ<int,int>
              (local_18,"lmd::bind(&Thing::fn, &thing)(1, 2, 3)","6",(int *)&local_28,
               (int *)&local_20);
    if (local_18[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_28);
      if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
                 ,0x1a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_28.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_28.ptr_ + 8))();
        }
        local_28.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_28.ptr_._0_4_ = 6;
      local_20.data_._0_4_ = 6;
      testing::internal::CmpHelperEQ<int,int>
                (local_18,"lmd::bind(&Thing::fn, &thing, 1)(2, 3)","6",(int *)&local_28,
                 (int *)&local_20);
      if (local_18[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_28);
        if (local_10.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_20,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
                   ,0x1b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
        testing::internal::AssertHelper::~AssertHelper(&local_20);
        if (local_28.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_28.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_28.ptr_ + 8))();
          }
          local_28.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_28.ptr_._0_4_ = 6;
        local_20.data_._0_4_ = 6;
        testing::internal::CmpHelperEQ<int,int>
                  (local_18,"lmd::bind(&Thing::fn, &thing, 1, 2)(3)","6",(int *)&local_28,
                   (int *)&local_20);
        if (local_18[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_28);
          if (local_10.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_20,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
                     ,0x1c,pcVar2);
          testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
          testing::internal::AssertHelper::~AssertHelper(&local_20);
          if (local_28.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_28.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_28.ptr_ + 8))();
            }
            local_28.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_28.ptr_._0_4_ = 6;
          local_20.data_._0_4_ = 6;
          testing::internal::CmpHelperEQ<int,int>
                    (local_18,"lmd::bind(&Thing::fn, &thing, 1, 2, 3)()","6",(int *)&local_28,
                     (int *)&local_20);
          if (local_18[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_28);
            if (local_10.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_20,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
                       ,0x1d,pcVar2);
            testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
            testing::internal::AssertHelper::~AssertHelper(&local_20);
            if (local_28.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 (local_28.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_28.ptr_ + 8))();
              }
              local_28.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
      }
    }
  }
  return;
}

Assistant:

TEST(lambda, bind_mem_fn) {
    Thing thing;
    ASSERT_EQ(lmd::bind(&Thing::fn)(&thing, 1, 2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, &thing)(1, 2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, &thing, 1)(2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, &thing, 1, 2)(3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, &thing, 1, 2, 3)(), 6);
}